

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O0

bool __thiscall
Lib::
SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::SListIntermediateNode::NodePtrComparator>
::getPosition<Kernel::TermList::Top>
          (SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::SListIntermediateNode::NodePtrComparator>
           *this,Top key,Node ***pvalue,bool canCreate)

{
  long lVar1;
  Top key_00;
  Top key_01;
  Top key_02;
  byte bVar2;
  Comparison CVar3;
  Node **ppNVar4;
  long *in_RCX;
  undefined1 in_DL;
  SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::SListIntermediateNode::NodePtrComparator>
  *in_RSI;
  long *in_RDI;
  byte in_R8B;
  Node *next;
  Node *left;
  uint h;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::SListIntermediateNode::NodePtrComparator>
  *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff94;
  long local_60;
  uint local_54;
  undefined4 local_18;
  
  local_18 = CONCAT31(local_18._1_3_,in_DL);
  bVar2 = in_R8B & 1;
  *in_RCX = 0;
  if ((int)in_RDI[1] == 0) {
    if (bVar2 != 0) {
      key_00._inner._inner._8_4_ = in_stack_ffffffffffffff94;
      key_00._inner._inner._0_8_ = in_stack_ffffffffffffff8c;
      ppNVar4 = insertPosition<Kernel::TermList::Top>(in_stack_ffffffffffffff70,key_00);
      *in_RCX = (long)ppNVar4;
    }
  }
  else {
    local_54 = (int)in_RDI[1] - 1;
    lVar1 = *in_RDI;
    while( true ) {
      while( true ) {
        while (local_60 = lVar1, lVar1 = *(long *)(local_60 + 8 + (ulong)local_54 * 8), lVar1 == 0)
        {
          if (local_54 == 0) {
            if (bVar2 != 0) {
              key_01._inner._inner._8_4_ = local_18;
              key_01._inner._inner._0_8_ = in_RSI;
              ppNVar4 = insertPosition<Kernel::TermList::Top>(in_stack_ffffffffffffff70,key_01);
              *in_RCX = (long)ppNVar4;
            }
            return false;
          }
          local_54 = local_54 - 1;
          lVar1 = local_60;
        }
        CVar3 = Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::
                SListIntermediateNode::NodePtrComparator::compare
                          ((Top *)in_stack_ffffffffffffff70,
                           (Node *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        if (CVar3 == LESS) break;
        if (CVar3 == EQUAL) {
          *in_RCX = lVar1;
          return true;
        }
        if (CVar3 != GREATER) {
          lVar1 = local_60;
        }
      }
      if (local_54 == 0) break;
      local_54 = local_54 - 1;
      lVar1 = local_60;
    }
    if (bVar2 != 0) {
      key_02._inner._inner._8_4_ = in_stack_ffffffffffffff94;
      key_02._inner._inner._0_8_ = in_stack_ffffffffffffff8c;
      ppNVar4 = insertPosition<Kernel::TermList::Top>(in_RSI,key_02);
      *in_RCX = (long)ppNVar4;
    }
  }
  return false;
}

Assistant:

bool getPosition(Key key, Value*& pvalue, bool canCreate)
  {
    pvalue = nullptr;

    if(_top==0) {
      if(canCreate) {
	pvalue = insertPosition(key);
      }
      return false;
    }

    unsigned h = _top-1;

   // left is a node with a value smaller than that of newNode and having
    // a large enough height.
    // this node is on the left of the inserted one
    Node* left = _left;
    for (;;) {
      Node* next = left->nodes[h];
      if (next == 0) {
	if (h == 0) {
	    if(canCreate) {
	      pvalue=insertPosition(key);
	    }
	    return false;
	}
	h--;
	continue;
      }
      // next != 0
      switch (ValueComparator::compare(key,next->value))
	{
	case LESS:
	  // the node should be inserted on the left
	  if (h == 0) {
	    if(canCreate) {
	      pvalue=insertPosition(key);
	    }
	    return false;
	  }
	  h--;
	  break;

	case EQUAL:
	  pvalue=&next->value;
	  return true;

	case GREATER:
	  left = next;
	  break;

#if VDEBUG
	default:
	  ASSERTION_VIOLATION;
#endif
	}
    }
  }